

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathFuncs.cpp
# Opt level: O3

void __thiscall slang::ast::builtins::Clog2Function::~Clog2Function(Clog2Function *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer p;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005ec008;
  p = (this->super_SystemSubroutine).name._M_dataplus._M_p;
  paVar1 = &(this->super_SystemSubroutine).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)p != paVar1) {
    operator_delete(p,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x38);
  return;
}

Assistant:

Clog2Function() : SystemSubroutine(KnownSystemName::Clog2, SubroutineKind::Function) {}